

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void NeedsFilter_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int thresh,__m128i *mask)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 in_R8B;
  char *in_R9;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  __m128i m_thresh;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  __m128i t7;
  __m128i t6;
  __m128i t5;
  __m128i t4;
  __m128i t3;
  __m128i t2;
  __m128i kFE;
  __m128i t1;
  
  auVar4[1] = in_R8B;
  auVar4[0] = in_R8B;
  auVar4[2] = in_R8B;
  auVar4[3] = in_R8B;
  auVar4[4] = in_R8B;
  auVar4[5] = in_R8B;
  auVar4[6] = in_R8B;
  auVar4[7] = in_R8B;
  auVar4[9] = in_R8B;
  auVar4[8] = in_R8B;
  auVar4[10] = in_R8B;
  auVar4[0xb] = in_R8B;
  auVar4[0xc] = in_R8B;
  auVar4[0xd] = in_R8B;
  auVar4[0xe] = in_R8B;
  auVar4[0xf] = in_R8B;
  auVar6 = psubusb(*in_RCX,*in_RDI);
  auVar3 = psubusb(*in_RDI,*in_RCX);
  local_1a8 = auVar6._0_8_;
  uStack_1a0 = auVar6._8_8_;
  local_1b8 = auVar3._0_8_;
  uStack_1b0 = auVar3._8_8_;
  uVar2 = (local_1a8 | local_1b8) & 0xfefefefefefefefe;
  uVar5 = (uStack_1a0 | uStack_1b0) & 0xfefefefefefefefe;
  t5[1]._0_2_ = (ushort)uVar2;
  t5[1]._2_2_ = (ushort)(uVar2 >> 0x10);
  t5[1]._4_2_ = (ushort)(uVar2 >> 0x20);
  t4[0]._0_2_ = (ushort)uVar5;
  t4[0]._2_2_ = (ushort)(uVar5 >> 0x10);
  t4[0]._4_2_ = (ushort)(uVar5 >> 0x20);
  auVar6 = psubusb(*in_RDX,*in_RSI);
  auVar3 = psubusb(*in_RSI,*in_RDX);
  local_1c8 = auVar6._0_8_;
  uStack_1c0 = auVar6._8_8_;
  local_1d8 = auVar3._0_8_;
  uStack_1d0 = auVar3._8_8_;
  auVar1._8_8_ = uStack_1c0 | uStack_1d0;
  auVar1._0_8_ = local_1c8 | local_1d8;
  auVar6._8_8_ = uStack_1c0 | uStack_1d0;
  auVar6._0_8_ = local_1c8 | local_1d8;
  auVar6 = paddusb(auVar1,auVar6);
  auVar3._2_2_ = t5[1]._2_2_ >> 1;
  auVar3._0_2_ = (ushort)t5[1] >> 1;
  auVar3._4_2_ = t5[1]._4_2_ >> 1;
  auVar3._6_2_ = (ushort)(uVar2 >> 0x31);
  auVar3._10_2_ = t4[0]._2_2_ >> 1;
  auVar3._8_2_ = (ushort)t4[0] >> 1;
  auVar3._12_2_ = t4[0]._4_2_ >> 1;
  auVar3._14_2_ = (ushort)(uVar5 >> 0x31);
  auVar3 = paddusb(auVar6,auVar3);
  auVar4 = psubusb(auVar3,auVar4);
  local_d8 = auVar4[0];
  cStack_d7 = auVar4[1];
  cStack_d6 = auVar4[2];
  cStack_d5 = auVar4[3];
  cStack_d4 = auVar4[4];
  cStack_d3 = auVar4[5];
  cStack_d2 = auVar4[6];
  cStack_d1 = auVar4[7];
  cStack_d0 = auVar4[8];
  cStack_cf = auVar4[9];
  cStack_ce = auVar4[10];
  cStack_cd = auVar4[0xb];
  cStack_cc = auVar4[0xc];
  cStack_cb = auVar4[0xd];
  cStack_ca = auVar4[0xe];
  cStack_c9 = auVar4[0xf];
  *in_R9 = -(local_d8 == '\0');
  in_R9[1] = -(cStack_d7 == '\0');
  in_R9[2] = -(cStack_d6 == '\0');
  in_R9[3] = -(cStack_d5 == '\0');
  in_R9[4] = -(cStack_d4 == '\0');
  in_R9[5] = -(cStack_d3 == '\0');
  in_R9[6] = -(cStack_d2 == '\0');
  in_R9[7] = -(cStack_d1 == '\0');
  in_R9[8] = -(cStack_d0 == '\0');
  in_R9[9] = -(cStack_cf == '\0');
  in_R9[10] = -(cStack_ce == '\0');
  in_R9[0xb] = -(cStack_cd == '\0');
  in_R9[0xc] = -(cStack_cc == '\0');
  in_R9[0xd] = -(cStack_cb == '\0');
  in_R9[0xe] = -(cStack_ca == '\0');
  in_R9[0xf] = -(cStack_c9 == '\0');
  return;
}

Assistant:

static WEBP_INLINE void NeedsFilter_SSE2(const __m128i* const p1,
                                         const __m128i* const p0,
                                         const __m128i* const q0,
                                         const __m128i* const q1,
                                         int thresh, __m128i* const mask) {
  const __m128i m_thresh = _mm_set1_epi8((char)thresh);
  const __m128i t1 = MM_ABS(*p1, *q1);        // abs(p1 - q1)
  const __m128i kFE = _mm_set1_epi8((char)0xFE);
  const __m128i t2 = _mm_and_si128(t1, kFE);  // set lsb of each byte to zero
  const __m128i t3 = _mm_srli_epi16(t2, 1);   // abs(p1 - q1) / 2

  const __m128i t4 = MM_ABS(*p0, *q0);        // abs(p0 - q0)
  const __m128i t5 = _mm_adds_epu8(t4, t4);   // abs(p0 - q0) * 2
  const __m128i t6 = _mm_adds_epu8(t5, t3);   // abs(p0-q0)*2 + abs(p1-q1)/2

  const __m128i t7 = _mm_subs_epu8(t6, m_thresh);  // mask <= m_thresh
  *mask = _mm_cmpeq_epi8(t7, _mm_setzero_si128());
}